

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ScalarReplacementPass::CheckAnnotations
          (ScalarReplacementPass *this,Instruction *varInst)

{
  uint32_t uVar1;
  DecorationManager *this_00;
  pointer ppIVar2;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_38
  ;
  
  this_00 = Pass::get_decoration_mgr((Pass *)this);
  uVar1 = Instruction::result_id(varInst);
  analysis::DecorationManager::GetDecorationsFor
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &local_38,this_00,uVar1,false);
  for (ppIVar2 = local_38._M_impl.super__Vector_impl_data._M_start;
      ppIVar2 != local_38._M_impl.super__Vector_impl_data._M_finish; ppIVar2 = ppIVar2 + 1) {
    if ((*ppIVar2)->opcode_ != OpDecorate) {
      __assert_fail("inst->opcode() == spv::Op::OpDecorate",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                    ,0x2c7,
                    "bool spvtools::opt::ScalarReplacementPass::CheckAnnotations(const Instruction *) const"
                   );
    }
    uVar1 = Instruction::GetSingleWordInOperand(*ppIVar2,1);
    if (((0x2e < uVar1) || ((0x7000000c0000U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
       (1 < uVar1 - 0x14eb)) break;
  }
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&local_38);
  return ppIVar2 == local_38._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool ScalarReplacementPass::CheckAnnotations(const Instruction* varInst) const {
  for (auto inst :
       get_decoration_mgr()->GetDecorationsFor(varInst->result_id(), false)) {
    assert(inst->opcode() == spv::Op::OpDecorate);
    auto decoration = spv::Decoration(inst->GetSingleWordInOperand(1u));
    switch (decoration) {
      case spv::Decoration::Invariant:
      case spv::Decoration::Restrict:
      case spv::Decoration::Alignment:
      case spv::Decoration::AlignmentId:
      case spv::Decoration::MaxByteOffset:
      case spv::Decoration::AliasedPointer:
      case spv::Decoration::RestrictPointer:
        break;
      default:
        return false;
    }
  }

  return true;
}